

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

string * __thiscall
cnn::BinaryLogLoss::as_string
          (string *__return_storage_ptr__,BinaryLogLoss *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  pointer pbVar1;
  ostream *poVar2;
  ostringstream os;
  char local_191;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"binary_log_loss(",0x10);
  pbVar1 = (arg_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  pbVar1 = (arg_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,pbVar1[1]._M_dataplus._M_p,pbVar1[1]._M_string_length);
  local_191 = ')';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_191,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string BinaryLogLoss::as_string(const vector<string>& arg_names) const {
  ostringstream os;
  os << "binary_log_loss(" << arg_names[0] << ", " << arg_names[1] << ')';
  return os.str();
}